

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void wallet::coinselector_tests::waste_test_invoker(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  unit_test_log_t *puVar3;
  ios_base *this;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  waste_test t;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_bb0;
  char *local_ba8;
  char *local_ba0;
  char *local_b98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b50;
  char *local_b48;
  char *local_b40;
  char *local_b38;
  undefined1 local_b30 [112];
  ios_base local_ac0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  undefined1 local_998 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820 [62];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b38 = "";
  memset((ostringstream *)local_998,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
  local_820[0]._M_string_length = 0;
  local_820[0].field_2._M_local_buf[0] = '\0';
  local_b30[0] = (ostringstream)0x22;
  local_820[0]._M_dataplus._M_p = (pointer)&local_820[0].field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_998,local_b30,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_998,"waste_test",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_998,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (local_820,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b30);
  if ((undefined1 *)CONCAT71(local_b30._1_7_,local_b30[0]) != local_b30 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_b30._1_7_,local_b30[0]),local_b30._16_8_ + 1);
  }
  local_b50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_820[0]._M_dataplus._M_p;
  local_b48 = local_820[0]._M_dataplus._M_p + local_820[0]._M_string_length;
  file.m_end = (iterator)0x36a;
  file.m_begin = (iterator)&local_b40;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file,(size_t)&local_b50,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_820[0]._M_dataplus._M_p != &local_820[0].field_2) {
    operator_delete(local_820[0]._M_dataplus._M_p,
                    CONCAT71(local_820[0].field_2._M_allocated_capacity._1_7_,
                             local_820[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
  std::ios_base::~ios_base((ios_base *)(local_998 + 0x70));
  WalletTestingSetup::WalletTestingSetup((WalletTestingSetup *)local_998,MAIN);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b58 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  paVar1 = &local_9b8.field_2;
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"waste_test",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  paVar2 = &local_58.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_b70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_b68 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_00.m_end = (iterator)0x36a;
  file_00.m_begin = (iterator)&local_b60;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_00,(size_t)&local_b70,msg_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  std::ios_base::~ios_base(local_ac0);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b78 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"waste_test",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_b90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_b88 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_01.m_end = (iterator)0x36a;
  file_01.m_begin = (iterator)&local_b80;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_01,(size_t)&local_b90,msg_01);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  this = local_ac0;
  std::ios_base::~ios_base(this);
  waste_test::test_method((waste_test *)this);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_ba0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_b98 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"waste_test",10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_b30,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_bb0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_ba8 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_02.m_end = (iterator)0x36a;
  file_02.m_begin = (iterator)&local_ba0;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_02,(size_t)&local_bb0,msg_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  std::ios_base::~ios_base(local_ac0);
  puVar3 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_bc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_bb8 = "";
  memset((ostringstream *)local_b30,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b30);
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p._0_1_ = 0x22;
  local_9b8._M_dataplus._M_p = (pointer)paVar1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,(char *)&local_58,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"waste_test",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_b30,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_9b8,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_58._M_dataplus._M_p._1_7_,local_58._M_dataplus._M_p._0_1_),
                    local_58.field_2._M_allocated_capacity + 1);
  }
  local_bd0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b8._M_dataplus._M_p;
  local_bc8 = local_9b8._M_dataplus._M_p + local_9b8._M_string_length;
  file_03.m_end = (iterator)0x36a;
  file_03.m_begin = (iterator)&local_bc0;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar3,file_03,(size_t)&local_bd0,msg_03);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_9b8._M_dataplus._M_p,
                    CONCAT71(local_9b8.field_2._M_allocated_capacity._1_7_,
                             local_9b8.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b30);
  std::ios_base::~ios_base(local_ac0);
  WalletTestingSetup::~WalletTestingSetup((WalletTestingSetup *)local_998);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(waste_test)
{
    const CAmount fee{100};
    const CAmount min_viable_change{300};
    const CAmount change_cost{125};
    const CAmount change_fee{30};
    const CAmount fee_diff{40};
    const CAmount in_amt{3 * COIN};
    const CAmount target{2 * COIN};
    const CAmount excess{80};
    const CAmount exact_target{in_amt - fee * 2}; // Maximum spendable amount after fees: no change, no excess

    // In the following, we test that the waste is calculated correctly in various scenarios.
    // Usually, RecalculateWaste would compute change_fee and change_cost on basis of the
    // change output type, current feerate, and discard_feerate, but we use fixed values
    // across this test to make the test easier to understand.
    {
        // Waste with change is the change cost and difference between fee and long term fee
        SelectionResult selection1{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection1, /*fee=*/fee, /*long_term_fee=*/fee - fee_diff);
        add_coin(2 * COIN, 2, selection1, fee, fee - fee_diff);
        selection1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + change_cost, selection1.GetWaste());

        // Waste will be greater when fee is greater, but long term fee is the same
        SelectionResult selection2{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection2, fee * 2, fee - fee_diff);
        add_coin(2 * COIN, 2, selection2, fee * 2, fee - fee_diff);
        selection2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_GT(selection2.GetWaste(), selection1.GetWaste());

        // Waste with change is the change cost and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection3{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection3, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection3, fee, fee + fee_diff);
        selection3.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + change_cost, selection3.GetWaste());
        BOOST_CHECK_LT(selection3.GetWaste(), selection1.GetWaste());
    }

    {
        // Waste without change is the excess and difference between fee and long term fee
        SelectionResult selection_nochange1{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange1, fee, fee - fee_diff);
        add_coin(2 * COIN, 2, selection_nochange1, fee, fee - fee_diff);
        selection_nochange1.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * 2 + excess, selection_nochange1.GetWaste());

        // Waste without change is the excess and difference between fee and long term fee
        // With long term fee greater than fee, waste should be less than when long term fee is less than fee
        SelectionResult selection_nochange2{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection_nochange2, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection_nochange2, fee, fee + fee_diff);
        selection_nochange2.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(fee_diff * -2 + excess, selection_nochange2.GetWaste());
        BOOST_CHECK_LT(selection_nochange2.GetWaste(), selection_nochange1.GetWaste());
    }

    {
        // Waste with change and fee == long term fee is just cost of change
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(change_cost, selection.GetWaste());
    }

    {
        // Waste without change and fee == long term fee is just the excess
        SelectionResult selection{exact_target - excess, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(excess, selection.GetWaste());
    }

    {
        // Waste is 0 when fee == long_term_fee, no change, and no excess
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee);
        add_coin(2 * COIN, 2, selection, fee, fee);
        selection.RecalculateWaste(min_viable_change, change_cost , change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-cost_of_change), and no excess
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, /*change_cost=*/fee_diff * 2, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Waste is 0 when (fee - long_term_fee) == (-excess), no change cost
        const CAmount new_target{exact_target - /*excess=*/fee_diff * 2};
        SelectionResult selection{new_target, SelectionAlgorithm::MANUAL};
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(0, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and the selected value == target
        SelectionResult selection{exact_target, SelectionAlgorithm::MANUAL};
        const CAmount target_waste1{-2 * fee_diff}; // = (2 * fee) - (2 * (fee + fee_diff))
        add_coin(1 * COIN, 1, selection, fee, fee + fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste1, selection.GetWaste());
    }

    {
        // Negative waste when the long term fee is greater than the current fee and change_cost < - (inputs * (fee - long_term_fee))
        SelectionResult selection{target, SelectionAlgorithm::MANUAL};
        const CAmount large_fee_diff{90};
        const CAmount target_waste2{-2 * large_fee_diff + change_cost};
        // = (2 * fee) - (2 * (fee + large_fee_diff)) + change_cost
        // = (2 * 100) - (2 * (100 + 90)) + 125
        // = 200 - 380 + 125 = -55
        assert(target_waste2 == -55);
        add_coin(1 * COIN, 1, selection, fee, fee + large_fee_diff);
        add_coin(2 * COIN, 2, selection, fee, fee + large_fee_diff);
        selection.RecalculateWaste(min_viable_change, change_cost, change_fee);
        BOOST_CHECK_EQUAL(target_waste2, selection.GetWaste());
    }
}